

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DequoteToken(Token *p)

{
  uint i;
  Token *p_local;
  
  if ((1 < p->n) && ((""[(byte)*p->z] & 0x80) != 0)) {
    for (i = 1; i < p->n - 1; i = i + 1) {
      if ((""[(byte)p->z[i]] & 0x80) != 0) {
        return;
      }
    }
    p->n = p->n - 2;
    p->z = p->z + 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DequoteToken(Token *p){
  unsigned int i;
  if( p->n<2 ) return;
  if( !sqlite3Isquote(p->z[0]) ) return;
  for(i=1; i<p->n-1; i++){
    if( sqlite3Isquote(p->z[i]) ) return;
  }
  p->n -= 2;
  p->z++;
}